

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

void __thiscall QTableWidget::dropEvent(QTableWidget *this,QDropEvent *event)

{
  long *plVar1;
  char cVar2;
  DragDropMode DVar3;
  QTableWidget *pQVar4;
  QTableWidgetItem *t;
  value_type item;
  QModelIndex *index;
  int *piVar5;
  long lVar6;
  int iVar7;
  int row_00;
  QModelIndex *index_2;
  int column;
  QModelIndex *index_1;
  int iVar8;
  long in_FS_OFFSET;
  int row;
  int col;
  QArrayDataPointer<QTableWidgetItem_*> local_98;
  QArrayDataPointer<QModelIndex> local_78;
  int local_58;
  int local_54;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&(this->super_QTableView).super_QAbstractItemView.super_QAbstractScrollArea.
                      super_QFrame.super_QWidget.field_0x8;
  pQVar4 = (QTableWidget *)QDropEvent::source();
  if (pQVar4 == this) {
    if (*(int *)(event + 0x2c) != 2) {
      DVar3 = QAbstractItemView::dragDropMode((QAbstractItemView *)this);
      if (DVar3 != InternalMove) goto LAB_00539807;
    }
    local_50 = 0xffffffffffffffff;
    local_54 = -1;
    local_58 = -1;
    local_48 = 0;
    uStack_40 = 0;
    if (event[0xc] == (QDropEvent)0x0) {
      cVar2 = (**(code **)(*plVar1 + 0x110))(plVar1,event,&local_58,&local_54,&local_50);
      if (((cVar2 != '\0') && (local_58 == -1)) && (local_54 == -1)) {
        local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d._0_4_ = 0xaaaaaaaa;
        local_78.d._4_4_ = 0xaaaaaaaa;
        local_78.ptr._0_4_ = 0xaaaaaaaa;
        local_78.ptr._4_4_ = 0xaaaaaaaa;
        (**(code **)(*(long *)&(this->super_QTableView).super_QAbstractItemView.
                               super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x2d8))
                  (&local_78,this);
        piVar5 = (int *)CONCAT44(local_78.ptr._4_4_,local_78.ptr._0_4_);
        iVar8 = 0x7fffffff;
        iVar7 = 0x7fffffff;
        for (lVar6 = local_78.size * 0x18; lVar6 != 0; lVar6 = lVar6 + -0x18) {
          if (*piVar5 < iVar7) {
            iVar7 = *piVar5;
          }
          if (piVar5[1] < iVar8) {
            iVar8 = piVar5[1];
          }
          piVar5 = piVar5 + 6;
        }
        local_98.d = (Data *)0x0;
        local_98.ptr = (QTableWidgetItem **)0x0;
        local_98.size = 0;
        QList<QTableWidgetItem_*>::reserve
                  ((QList<QTableWidgetItem_*> *)&local_98,(long)(int)local_78.size);
        piVar5 = (int *)CONCAT44(local_78.ptr._4_4_,local_78.ptr._0_4_);
        for (lVar6 = local_78.size * 0x18; lVar6 != 0; lVar6 = lVar6 + -0x18) {
          t = takeItem(this,*piVar5,piVar5[1]);
          QList<QTableWidgetItem_*>::append((QList<QTableWidgetItem_*> *)&local_98,t);
          piVar5 = piVar5 + 6;
        }
        piVar5 = (int *)CONCAT44(local_78.ptr._4_4_,local_78.ptr._0_4_);
        for (lVar6 = local_78.size * 0x18; lVar6 != 0; lVar6 = lVar6 + -0x18) {
          row_00 = (*piVar5 - iVar7) + (int)local_50;
          column = (piVar5[1] - iVar8) + local_50._4_4_;
          item = QList<QTableWidgetItem_*>::takeFirst((QList<QTableWidgetItem_*> *)&local_98);
          setItem(this,row_00,column,item);
          piVar5 = piVar5 + 6;
        }
        event[0xc] = (QDropEvent)0x1;
        QArrayDataPointer<QTableWidgetItem_*>::~QArrayDataPointer(&local_98);
        QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_78);
      }
    }
    if (event[0xc] == (QDropEvent)0x1) {
      *(undefined1 *)((long)plVar1 + 0x3e5) = 1;
    }
  }
LAB_00539807:
  QTableView::dropEvent(&this->super_QTableView,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableWidget::dropEvent(QDropEvent *event) {
    Q_D(QTableWidget);
    if (event->source() == this && (event->dropAction() == Qt::MoveAction ||
                                    dragDropMode() == QAbstractItemView::InternalMove)) {
        QModelIndex topIndex;
        int col = -1;
        int row = -1;
        // check whether a subclass has already accepted the event, ie. moved the data
        if (!event->isAccepted() && d->dropOn(event, &row, &col, &topIndex) && row == -1 && col == -1) {
            // Drop onto item
            const QModelIndexList indexes = selectedIndexes();
            int top = INT_MAX;
            int left = INT_MAX;
            for (const auto &index : indexes) {
                top = qMin(index.row(), top);
                left = qMin(index.column(), left);
            }
            QList<QTableWidgetItem *> taken;
            const int indexesCount = indexes.size();
            taken.reserve(indexesCount);
            for (const auto &index : indexes)
                taken.append(takeItem(index.row(), index.column()));

            for (const auto &index : indexes) {
                int r = index.row() - top + topIndex.row();
                int c = index.column() - left + topIndex.column();
                setItem(r, c, taken.takeFirst());
            }

            event->accept();
        }
        // either we or a subclass accepted the drop event, so assume that the data was
        // moved and that QAbstractItemView shouldn't remove the source when QDrag::exec returns
        if (event->isAccepted())
            d->dropEventMoved = true;
    }

    QTableView::dropEvent(event);
}